

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<-14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<-5>,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<_14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<_5>,_boost::random::detail::no_tempering>
             *this)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar3 = detail::generic_modulo<unsigned_long,_19UL>::compute(this->index_);
  uVar4 = detail::generic_modulo<unsigned_long,_19UL>::compute(uVar3 + 0x12);
  uVar5 = detail::generic_modulo<unsigned_long,_19UL>::compute(uVar3 + 0x11);
  uVar6 = detail::generic_modulo<unsigned_long,_19UL>::compute(uVar3 + 0x10);
  uVar7 = detail::generic_modulo<unsigned_long,_19UL>::compute(uVar3 + 0xf);
  uVar8 = detail::generic_modulo<unsigned_long,_19UL>::compute(uVar3 + 0xe);
  uVar2 = this->state_[uVar4];
  uVar1 = this->state_[uVar5];
  uVar9 = this->state_[uVar7] << 0xe ^ this->state_[uVar8] ^ this->state_[uVar7];
  uVar10 = this->state_[uVar6] >> 0xb ^
           this->state_[uVar3] >> 0x13 ^ this->state_[uVar3] ^ this->state_[uVar6] ^ uVar9;
  this->state_[uVar3] = uVar10;
  uVar2 = uVar2 >> 0x12 ^ (uVar1 & 1 | uVar2 & 0xfffffffe) ^ uVar9 ^ uVar10 << 5;
  this->state_[uVar4] = uVar2;
  this->index_ = uVar4;
  return uVar2;
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }